

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3DeleteAll(Fts3Table *p,int bContent)

{
  long in_FS_OFFSET;
  int rc;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  rc = 0;
  sqlite3Fts3PendingTermsClear(p);
  if (bContent != 0) {
    fts3SqlExec(&rc,p,2,(sqlite3_value **)0x0);
  }
  fts3SqlExec(&rc,p,3,(sqlite3_value **)0x0);
  fts3SqlExec(&rc,p,4,(sqlite3_value **)0x0);
  if (p->bHasDocsize != '\0') {
    fts3SqlExec(&rc,p,5,(sqlite3_value **)0x0);
  }
  if (p->bHasStat != '\0') {
    fts3SqlExec(&rc,p,6,(sqlite3_value **)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return rc;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3DeleteAll(Fts3Table *p, int bContent){
  int rc = SQLITE_OK;             /* Return code */

  /* Discard the contents of the pending-terms hash table. */
  sqlite3Fts3PendingTermsClear(p);

  /* Delete everything from the shadow tables. Except, leave %_content as
  ** is if bContent is false.  */
  assert( p->zContentTbl==0 || bContent==0 );
  if( bContent ) fts3SqlExec(&rc, p, SQL_DELETE_ALL_CONTENT, 0);
  fts3SqlExec(&rc, p, SQL_DELETE_ALL_SEGMENTS, 0);
  fts3SqlExec(&rc, p, SQL_DELETE_ALL_SEGDIR, 0);
  if( p->bHasDocsize ){
    fts3SqlExec(&rc, p, SQL_DELETE_ALL_DOCSIZE, 0);
  }
  if( p->bHasStat ){
    fts3SqlExec(&rc, p, SQL_DELETE_ALL_STAT, 0);
  }
  return rc;
}